

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.hpp
# Opt level: O1

int __thiscall just::process::impl::output_file::close(output_file *this,int __fd)

{
  int iVar1;
  
  if (this->_fd != -1) {
    iVar1 = ::close(this->_fd);
    this->_fd = -1;
    return iVar1;
  }
  __assert_fail("_fd != invalid_fd()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/include/just/process.hpp"
                ,0x108,"void just::process::impl::output_file::close()");
}

Assistant:

void close()
        {
          assert(_fd != invalid_fd());
#ifdef _WIN32
          CloseHandle(_fd);
#else
          ::close(_fd);
#endif
          _fd = invalid_fd();
        }